

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptimized.cpp
# Opt level: O3

void anon_unknown.dwarf_23d889::writeFile
               (char *pFilename,int pHeight,int pWidth,EImageType pImageType,bool pIsStereo,
               Compression pCompression)

{
  uint pNbChannels;
  char *pcVar1;
  size_t xst;
  int iVar2;
  half *phVar3;
  half *phVar4;
  ChannelList *pCVar5;
  half *b;
  half *b_00;
  undefined7 in_register_00000081;
  undefined1 in_R10B;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  undefined8 *puVar10;
  int pWidth_local;
  int pHeight_local;
  size_t local_140;
  StringVector multiView;
  undefined1 local_120 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110 [2];
  char *local_e8;
  OutputFile lFile;
  FrameBuffer lOutputFrameBuffer;
  Header header;
  Array2D<half> lPixels;
  Array2D<half> local_48;
  
  local_140 = CONCAT44(local_140._4_4_,(int)CONCAT71(in_register_00000081,pIsStereo));
  pNbChannels = *(uint *)("\t\tRGBA file to RGBA framebuffer" + (long)(int)pImageType * 4 + 0x1d);
  uVar9 = (ulong)pNbChannels;
  lPixels._sizeX = 0;
  lPixels._sizeY = 0;
  lPixels._data = (half *)0x0;
  lVar7 = (long)pHeight;
  lVar6 = (long)(int)(pNbChannels * pWidth);
  uVar8 = 0xffffffffffffffff;
  if (-1 < lVar6 * lVar7) {
    uVar8 = lVar6 * lVar7 * 2;
  }
  pWidth_local = pWidth;
  pHeight_local = pHeight;
  local_e8 = pFilename;
  phVar3 = (half *)operator_new__(uVar8);
  lPixels._sizeX = lVar7;
  lPixels._sizeY = lVar6;
  lPixels._data = phVar3;
  fillPixels(&pHeight_local,&pWidth_local,&lPixels,pNbChannels,false);
  if ((char)local_140 == '\0') {
    local_120._0_4_ = 0.0;
    local_120._4_4_ = 0.0;
    Imf_2_5::Header::Header
              (&header,pWidth,pHeight,1.0,(V2f *)local_120,1.0,INCREASING_Y,pCompression);
    puVar10 = &(anonymous_namespace)::CHANNEL_NAMES;
    uVar8 = uVar9;
    do {
      pCVar5 = Imf_2_5::Header::channels(&header);
      pcVar1 = (char *)*puVar10;
      Imf_2_5::Channel::Channel((Channel *)local_120,HALF,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar5,pcVar1,(Channel *)local_120);
      puVar10 = puVar10 + 1;
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
    iVar2 = Imf_2_5::globalThreadCount();
    Imf_2_5::OutputFile::OutputFile((OutputFile *)&multiView,local_e8,&header,iVar2);
    lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
    lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    puVar10 = &(anonymous_namespace)::CHANNEL_NAMES;
    phVar4 = phVar3;
    lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      pcVar1 = (char *)*puVar10;
      Imf_2_5::Slice::Slice
                ((Slice *)local_120,HALF,(char *)phVar4,(ulong)(pNbChannels * 2),
                 (long)pWidth * (ulong)(pNbChannels * 2),1,1,0.0,(bool)in_R10B,false);
      Imf_2_5::FrameBuffer::insert(&lOutputFrameBuffer,pcVar1,(Slice *)local_120);
      phVar4 = phVar4 + 1;
      puVar10 = puVar10 + 1;
      uVar9 = uVar9 - 1;
    } while (uVar9 != 0);
    Imf_2_5::OutputFile::setFrameBuffer((OutputFile *)&multiView,&lOutputFrameBuffer);
    Imf_2_5::OutputFile::writePixels((OutputFile *)&multiView,pHeight);
    std::
    _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                 *)&lOutputFrameBuffer);
    Imf_2_5::OutputFile::~OutputFile((OutputFile *)&multiView);
    Imf_2_5::Header::~Header(&header);
  }
  else {
    phVar4 = (half *)operator_new__(uVar8);
    local_48._sizeX = lVar7;
    local_48._sizeY = lVar6;
    local_48._data = phVar4;
    fillPixels(&pHeight_local,&pWidth_local,&local_48,pNbChannels,true);
    local_120._0_4_ = 0.0;
    local_120._4_4_ = 0.0;
    Imf_2_5::Header::Header
              (&header,pWidth,pHeight,1.0,(V2f *)local_120,1.0,INCREASING_Y,pCompression);
    lVar6 = 0;
    uVar8 = uVar9;
    do {
      pCVar5 = Imf_2_5::Header::channels(&header);
      pcVar1 = *(char **)((long)&(anonymous_namespace)::CHANNEL_NAMES + lVar6);
      Imf_2_5::Channel::Channel((Channel *)local_120,HALF,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar5,pcVar1,(Channel *)local_120);
      pCVar5 = Imf_2_5::Header::channels(&header);
      pcVar1 = *(char **)((long)&(anonymous_namespace)::CHANNEL_NAMES_LEFT + lVar6);
      Imf_2_5::Channel::Channel((Channel *)local_120,HALF,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar5,pcVar1,(Channel *)local_120);
      lVar6 = lVar6 + 8;
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
    multiView.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    multiView.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    multiView.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_110[0]._M_allocated_capacity._0_4_ = 0x68676972;
    local_110[0]._M_local_buf[4] = 't';
    local_110[0]._M_local_buf[5] = '\0';
    local_120._8_8_ = (pointer)0x5;
    local_120._0_8_ = local_110;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&multiView,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._0_8_ != local_110) {
      operator_delete((void *)local_120._0_8_,
                      CONCAT26(local_110[0]._M_allocated_capacity._6_2_,
                               CONCAT15(local_110[0]._M_local_buf[5],
                                        CONCAT14(local_110[0]._M_local_buf[4],
                                                 (undefined4)local_110[0]._M_allocated_capacity))) +
                      1);
    }
    local_110[0]._M_allocated_capacity._0_4_ = 0x7466656c;
    local_120._8_8_ = (pointer)0x4;
    local_110[0]._M_local_buf[4] = '\0';
    local_120._0_8_ = local_110;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&multiView,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._0_8_ != local_110) {
      operator_delete((void *)local_120._0_8_,
                      CONCAT26(local_110[0]._M_allocated_capacity._6_2_,
                               CONCAT15(local_110[0]._M_local_buf[5],
                                        CONCAT14(local_110[0]._M_local_buf[4],
                                                 (undefined4)local_110[0]._M_allocated_capacity))) +
                      1);
    }
    Imf_2_5::
    TypedAttribute<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::TypedAttribute((TypedAttribute<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_120,&multiView);
    Imf_2_5::Header::insert(&header,"multiView",(Attribute *)local_120);
    local_120._0_8_ = &PTR__TypedAttribute_0049c100;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_120 + 8));
    Imf_2_5::Attribute::~Attribute((Attribute *)local_120);
    iVar2 = Imf_2_5::globalThreadCount();
    Imf_2_5::OutputFile::OutputFile(&lFile,local_e8,&header,iVar2);
    lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
    lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    xst = uVar9 * 2;
    local_140 = (long)pWidth * xst;
    lVar6 = 0;
    b = phVar4;
    b_00 = phVar3;
    lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      pcVar1 = *(char **)((long)&(anonymous_namespace)::CHANNEL_NAMES + lVar6);
      Imf_2_5::Slice::Slice
                ((Slice *)local_120,HALF,(char *)b_00,xst,local_140,1,1,0.0,(bool)in_R10B,false);
      Imf_2_5::FrameBuffer::insert(&lOutputFrameBuffer,pcVar1,(Slice *)local_120);
      pcVar1 = *(char **)((long)&(anonymous_namespace)::CHANNEL_NAMES_LEFT + lVar6);
      Imf_2_5::Slice::Slice
                ((Slice *)local_120,HALF,(char *)b,xst,local_140,1,1,0.0,(bool)in_R10B,false);
      Imf_2_5::FrameBuffer::insert(&lOutputFrameBuffer,pcVar1,(Slice *)local_120);
      b = b + 1;
      lVar6 = lVar6 + 8;
      b_00 = b_00 + 1;
      uVar9 = uVar9 - 1;
    } while (uVar9 != 0);
    Imf_2_5::OutputFile::setFrameBuffer(&lFile,&lOutputFrameBuffer);
    Imf_2_5::OutputFile::writePixels(&lFile,pHeight);
    std::
    _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                 *)&lOutputFrameBuffer);
    Imf_2_5::OutputFile::~OutputFile(&lFile);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&multiView);
    Imf_2_5::Header::~Header(&header);
    operator_delete__(phVar4);
  }
  operator_delete__(phVar3);
  return;
}

Assistant:

void
writeFile (const char pFilename[],
           int pHeight,
           int pWidth,
           EImageType pImageType,
           bool pIsStereo,
           Compression pCompression)
{
    const int lNbChannels = getNbChannels (pImageType);
    Array2D<half> lPixels;

    lPixels.resizeErase (pHeight, pWidth * lNbChannels);
    fillPixels (pHeight, pWidth, lPixels, lNbChannels, false);

    if(pIsStereo)
    {
        Array2D<half> lPixelsLeft;

        lPixelsLeft.resizeErase (pHeight, pWidth * lNbChannels);
        fillPixels (pHeight,
                    pWidth,
                    lPixelsLeft,
                    lNbChannels,
                    true);

        writePixels (pFilename,
                     pHeight,
                     pWidth,
                     lPixels,
                     lPixelsLeft,
                     lNbChannels,
                     pCompression);
    }
    else
    {
        writePixels (pFilename,
                    pHeight,
                    pWidth,
                    lPixels,
                    lNbChannels,
                    pCompression);
    }
}